

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_test_connection.c
# Opt level: O1

apx_error_t apx_serverTestConnection_create(apx_serverTestConnection_t *self)

{
  apx_error_t aVar1;
  adt_ary_t *paVar2;
  apx_connectionBaseVTable_t base_connection_vtable;
  apx_connectionInterface_t connection_interface;
  apx_connectionBaseVTable_t aStack_98;
  apx_connectionInterface_t local_68;
  
  if (self == (apx_serverTestConnection_t *)0x0) {
    aVar1 = 1;
  }
  else {
    self->default_buffer_size = 0x400;
    self->pending_bytes = 0;
    apx_connectionBaseVTable_create
              (&aStack_98,apx_serverTestConnection_vdestroy,apx_serverTestConnection_vstart,
               apx_serverTestConnection_vclose);
    local_68.remote_file_published_notification = (_func_apx_error_t_void_ptr_apx_file_t_ptr *)0x0;
    local_68.remote_file_write_notification =
         (_func_apx_error_t_void_ptr_apx_file_t_ptr_uint32_t_uint8_t_ptr_apx_size_t *)0x0;
    local_68.transmit_max_buffer_size = apx_serverTestConnection_vtransmit_max_bytes_avaiable;
    local_68.transmit_current_bytes_avaiable =
         apx_serverTestConnection_vtransmit_current_bytes_avaiable;
    local_68.transmit_begin = apx_serverTestConnection_vtransmit_begin;
    local_68.transmit_end = apx_serverTestConnection_vtransmit_end;
    local_68.transmit_data_message = apx_serverTestConnection_vtransmit_data_message;
    local_68.transmit_direct_message = apx_serverTestConnection_vtransmit_direct_message;
    local_68.arg = self;
    aVar1 = apx_serverConnection_create(&self->base,&aStack_98,&local_68);
    if (aVar1 == 0) {
      paVar2 = adt_ary_new(adt_bytearray_vdelete);
      self->transmit_log = paVar2;
      if (paVar2 == (adt_ary_t *)0x0) {
        aVar1 = 2;
      }
      else {
        aVar1 = 0;
        adt_bytearray_create(&self->transmit_buffer,0);
      }
    }
    if (aVar1 == 0) {
      apx_nodeManager_create(&self->node_manager,'\x02');
      apx_serverConnection_attach_node_manager(&self->base,&self->node_manager);
    }
  }
  return aVar1;
}

Assistant:

apx_error_t apx_serverTestConnection_create(apx_serverTestConnection_t *self)
{
   if (self != NULL)
   {
      apx_connectionBaseVTable_t base_connection_vtable;
      apx_connectionInterface_t connection_interface;
      self->default_buffer_size = 1024u;
      self->pending_bytes = 0u;
      apx_connectionBaseVTable_create(&base_connection_vtable,
         apx_serverTestConnection_vdestroy,
         apx_serverTestConnection_vstart,
         apx_serverTestConnection_vclose);
      create_connection_interface_vtable(self, &connection_interface);
      apx_error_t result = apx_serverConnection_create(&self->base, &base_connection_vtable, &connection_interface);
      if (result == APX_NO_ERROR)
      {
         self->transmit_log = adt_ary_new(adt_bytearray_vdelete);
         if (self->transmit_log == NULL)
         {
            result = APX_MEM_ERROR;
         }
         else
         {
            adt_bytearray_create(&self->transmit_buffer, 0u);
         }
      }
      if (result == APX_NO_ERROR)
      {
         apx_nodeManager_create(&self->node_manager, APX_SERVER_MODE);
         apx_serverConnection_attach_node_manager(&self->base, &self->node_manager);
      }
      return result;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}